

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronVErrMemory(xmlSchematronValidCtxtPtr ctxt,char *extra,xmlNodePtr node)

{
  xmlNodePtr node_local;
  char *extra_local;
  xmlSchematronValidCtxtPtr ctxt_local;
  
  if (ctxt != (xmlSchematronValidCtxtPtr)0x0) {
    ctxt->nberrors = ctxt->nberrors + 1;
    ctxt->err = 0x71a;
  }
  __xmlSimpleError(0x11,2,node,(char *)0x0,extra);
  return;
}

Assistant:

static void
xmlSchematronVErrMemory(xmlSchematronValidCtxtPtr ctxt,
                        const char *extra, xmlNodePtr node)
{
    if (ctxt != NULL) {
        ctxt->nberrors++;
        ctxt->err = XML_SCHEMAV_INTERNAL;
    }
    __xmlSimpleError(XML_FROM_SCHEMASV, XML_ERR_NO_MEMORY, node, NULL,
                     extra);
}